

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getFrameVel
          (KinDynComputations *this,FrameIndex frameIdx,Span<double,__1L> twist)

{
  pointer local_a0;
  undefined8 local_98;
  Matrix<double,_6,_1,_0,_6,_1> local_88;
  KinDynComputations local_50 [3];
  
  if (twist.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    getFrameVel(local_50,(FrameIndex)this);
    toEigen(&local_88,(SpatialMotionVector *)local_50);
    local_98 = 6;
    local_a0 = twist.storage_.data_;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a0,
               &local_88);
  }
  else {
    iDynTree::reportError("KinDynComputations","getFrameVel","Wrong size in input twist");
  }
  return twist.storage_.super_extent_type<_1L>.size_.size_ == 6;
}

Assistant:

bool KinDynComputations::getFrameVel(const FrameIndex frameIdx, Span<double>twist)
{

    constexpr int expected_twist_size = 6;
    bool ok = twist.size() == expected_twist_size;
    if( !ok )
    {
        reportError("KinDynComputations","getFrameVel","Wrong size in input twist");
        return false;
    }


    toEigen(twist) = toEigen(getFrameVel(frameIdx));
    return true;
}